

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_manager.c
# Opt level: O0

apx_error_t apx_nodeManager_build_node(apx_nodeManager_t *self,char *definition_text)

{
  size_t sVar1;
  apx_node_t *node_00;
  apx_node_t *node;
  apx_error_t result;
  size_t definition_size;
  char *definition_text_local;
  apx_nodeManager_t *self_local;
  
  if ((self == (apx_nodeManager_t *)0x0) || (definition_text == (char *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    sVar1 = strlen(definition_text);
    self_local._4_4_ = apx_parser_parse_cstr(&self->parser,definition_text);
    if (self_local._4_4_ == 0) {
      node_00 = apx_parser_take_last_node(&self->parser);
      if (node_00 == (apx_node_t *)0x0) {
        __assert_fail("node != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                      ,0x86,
                      "apx_error_t apx_nodeManager_build_node(apx_nodeManager_t *, const char *)");
      }
      self_local._4_4_ =
           create_node_instance(self,node_00,(uint8_t *)definition_text,(apx_size_t)sVar1);
      apx_node_delete(node_00);
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_nodeManager_build_node(apx_nodeManager_t* self, char const* definition_text)
{
   if ((self != NULL) && (definition_text != NULL))
   {
      size_t definition_size = strlen(definition_text);
      apx_error_t result = apx_parser_parse_cstr(&self->parser, definition_text);
      apx_node_t* node = NULL;
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      node = apx_parser_take_last_node(&self->parser);
      assert(node != NULL);
      result = create_node_instance(self, node, (uint8_t const*)definition_text, (apx_size_t)definition_size);
      apx_node_delete(node);
      return result;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}